

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O1

void __thiscall variant_take_copy_Test::TestBody(variant_take_copy_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  AssertHelper local_18;
  Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_C> local_10;
  
  local_10.storage_ = (storage_type)0x0;
  local_10.index_ = '\0';
  local_10._5_3_ = 0;
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"ctor_count","0",&TestBody::ctor_count,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xaa,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"dtor_count","0",&TestBody::dtor_count,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xab,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  if (2 < local_10.index_) {
    state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_C>::
    get<C,_0>(&local_10);
    TestBody::dtor_count = TestBody::dtor_count + 1;
  }
  TestBody::ctor_count = TestBody::ctor_count + 1;
  local_10.index_ = '\x03';
  local_30.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"ctor_count","1",&TestBody::ctor_count,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xae,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"dtor_count","0",&TestBody::dtor_count,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xaf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_C>::get<C,_0>
            (&local_10);
  TestBody::ctor_count = TestBody::ctor_count + 1;
  if (2 < local_10.index_) {
    state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_C>::
    get<C,_0>(&local_10);
    TestBody::dtor_count = TestBody::dtor_count + 1;
  }
  local_10.index_ = '\0';
  local_30.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"ctor_count","2",&TestBody::ctor_count,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xb3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_30.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"dtor_count","1",&TestBody::dtor_count,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xb4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  TestBody::dtor_count = TestBody::dtor_count + 1;
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_C>::~Variant
            (&local_10);
  local_10.storage_ = (storage_type)0x2;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"ctor_count","2",&TestBody::ctor_count,(int *)&local_10);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_10);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xb7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_10);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_10 != (Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_C>)0x0) {
      (**(code **)(*(long *)local_10 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_10.storage_ = (storage_type)0x2;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"dtor_count","2",&TestBody::dtor_count,(int *)&local_10);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_10);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xb8,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_10);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_10 != (Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_C>)0x0) {
      (**(code **)(*(long *)local_10 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST(variant, move_type) {
    static constexpr int expected = 42;

    Variant<A, B> v{};

    ASSERT_TRUE(v.holds<empty>());

    const auto& a = v.set(A{expected});

    EXPECT_EQ(a.value, expected);
    ASSERT_TRUE(v.holds<A>());
    EXPECT_EQ(v.get<A>().value, expected);
}